

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MANU.cpp
# Opt level: O0

bool check(int i)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool local_2d;
  int local_2c;
  int iStack_28;
  bool ok;
  int dmax;
  int md;
  int mm;
  int my;
  int sd;
  int sm;
  int sy;
  int now;
  int i_local;
  
  iVar3 = local_time();
  iVar2 = ITEM[i].span / 0x16d;
  iVar1 = (ITEM[i].span + iVar2 * -0x16d) / 0x1e;
  local_2d = true;
  md = ITEM[i].manu / 10000 + iVar2;
  dmax = (ITEM[i].manu % 10000) / 100 + iVar1;
  iStack_28 = ITEM[i].manu % 100 + ITEM[i].span + iVar1 * -10;
  if (dmax != 1) {
    if (dmax == 2) {
      if ((md % 4 == 0) && (md % 100 != 0)) {
        local_2c = 0x1d;
      }
      else {
        local_2c = 0x1c;
      }
      goto LAB_00105d99;
    }
    if (dmax != 3) {
      if (dmax == 4) {
LAB_00105d89:
        local_2c = 0x1e;
        goto LAB_00105d99;
      }
      if (dmax != 5) {
        if (dmax == 6) goto LAB_00105d89;
        if (1 < dmax - 7U) {
          if (dmax == 9) goto LAB_00105d89;
          if (dmax != 10) {
            if (dmax == 0xb) goto LAB_00105d89;
            if (dmax != 0xc) goto LAB_00105d99;
          }
        }
      }
    }
  }
  local_2c = 0x1f;
LAB_00105d99:
  if (local_2c < iStack_28) {
    dmax = dmax + 1;
    iStack_28 = iStack_28 - local_2c;
  }
  if (0xc < dmax) {
    md = md + 1;
    dmax = dmax + -0xc;
  }
  if (((md < iVar3 / 10000) ||
      (dmax < (int)((long)((ulong)(uint)((int)((long)iVar3 % 10000) >> 0x1f) << 0x20 |
                          (long)iVar3 % 10000 & 0xffffffffU) / 100))) || (iStack_28 < iVar3 % 100))
  {
    local_2d = false;
  }
  return local_2d;
}

Assistant:

bool check(int i) {
    int now = local_time(), sy = ITEM[i].span / 365,
            sm = (ITEM[i].span - sy * 365) / 30, sd = ITEM[i].span - sm * 10,
            my = ITEM[i].manu / 10000, mm = (ITEM[i].manu % 10000) / 100,
            md = ITEM[i].manu % 100, dmax;
    bool ok = true;

    my += sy;
    mm += sm;
    md += sd;
    switch (mm) {
        case 2:
            if (my % 4 || !(my % 100)) {
                dmax = 28;
            } else {
                dmax = 29;
            }
            break;
        case 4:
        case 6:
        case 9:
        case 11:
            dmax = 30;
            break;
        case 1:
        case 3:
        case 5:
        case 7:
        case 8:
        case 10:
        case 12:
            dmax = 31;
    }
    if(md > dmax) {
        mm++;
        md -= dmax;
    }
    if(mm > 12) {
        my++;
        mm -= 12;
    }
    if (now / 10000 > my || (now % 10000) / 100 > mm || now % 100 > md) {
        ok = false;
    }
    return ok;
}